

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTaskManager.hpp
# Opt level: O1

void __thiscall sftm::CTaskManager::CTaskManager(CTaskManager *this)

{
  undefined8 *puVar1;
  long lVar2;
  
  lVar2 = 0x28;
  do {
    *(undefined8 *)((long)(this->m_workers)._M_elems[0].m_taskQueue.m_pItems + lVar2 + -0x50) = 0;
    *(undefined4 *)((long)(this->m_workers)._M_elems[0].m_taskQueue.m_pItems + lVar2 + -0x48) = 0;
    puVar1 = (undefined8 *)
             ((long)(this->m_workers)._M_elems[0].m_taskQueue.m_pItems + lVar2 + -0x40);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined1 *)((long)(this->m_workers)._M_elems[0].m_taskQueue.m_pItems + lVar2 + -0x30) = 0;
    *(undefined1 *)((long)(this->m_workers)._M_elems[0].m_taskQueue.m_pItems + lVar2 + -0x2f) = 0;
    memset((void *)((long)(this->m_workers)._M_elems[0].m_taskQueue.m_pItems + lVar2 + -0x28),0,
           0x1005);
    lVar2 = lVar2 + 0x1030;
  } while (lVar2 != 0x40c28);
  this->m_nWorkerCount = 0;
  std::condition_variable::condition_variable(&this->m_cvWorkerIdle);
  *(undefined8 *)((long)&(this->m_mtxWorkerIdle).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_mtxWorkerIdle).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_mtxWorkerIdle).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_mtxWorkerIdle).super___mutex_base._M_mutex + 8) = 0;
  (this->m_mtxWorkerIdle).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  return;
}

Assistant:

CTaskManager() noexcept {}